

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int attach_set_target(ATTACH_HANDLE attach,AMQP_VALUE target_value)

{
  int iVar1;
  AMQP_VALUE local_30;
  AMQP_VALUE target_amqp_value;
  ATTACH_INSTANCE *attach_instance;
  int result;
  AMQP_VALUE target_value_local;
  ATTACH_HANDLE attach_local;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    attach_instance._4_4_ = 0x11e6;
  }
  else {
    if (target_value == (AMQP_VALUE)0x0) {
      local_30 = (AMQP_VALUE)0x0;
    }
    else {
      local_30 = amqpvalue_clone(target_value);
    }
    if (local_30 == (AMQP_VALUE)0x0) {
      attach_instance._4_4_ = 0x11f6;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(attach->composite_value,6,local_30);
      if (iVar1 == 0) {
        attach_instance._4_4_ = 0;
      }
      else {
        attach_instance._4_4_ = 0x11fc;
      }
      amqpvalue_destroy(local_30);
    }
  }
  return attach_instance._4_4_;
}

Assistant:

int attach_set_target(ATTACH_HANDLE attach, AMQP_VALUE target_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        AMQP_VALUE target_amqp_value;
        if (target_value == NULL)
        {
            target_amqp_value = NULL;
        }
        else
        {
            target_amqp_value = amqpvalue_clone(target_value);
        }
        if (target_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(attach_instance->composite_value, 6, target_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(target_amqp_value);
        }
    }

    return result;
}